

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwrite.c
# Opt level: O2

int png_write_image_16bit(png_voidp argument)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  int iVar4;
  undefined8 *puVar5;
  png_const_structrp png_ptr;
  int iVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  ushort uVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  bool bVar16;
  
  puVar5 = *argument;
  png_ptr = *(png_const_structrp *)*puVar5;
  uVar3 = *(uint *)((long)puVar5 + 0x14);
  if ((uVar3 & 1) == 0) {
    png_error(png_ptr,"png_write_image: internal call error");
  }
  iVar10 = (uVar3 & 2) + 2;
  iVar13 = *(int *)(puVar5 + 2);
  uVar14 = -(ulong)((uVar3 & 0x20) != 0) | (ulong)(uVar3 & 2) + 1;
  uVar11 = (ulong)((uVar3 & 0x20) >> 4);
  uVar7 = *(long *)((long)argument + 0x38) + uVar11;
  lVar15 = uVar11 + *(long *)((long)argument + 0x28);
  iVar4 = *(int *)((long)puVar5 + 0xc);
  while (bVar16 = iVar13 != 0, iVar13 = iVar13 + -1, lVar8 = lVar15, uVar11 = uVar7, bVar16) {
    while (uVar11 < uVar7 + (ulong)(uint)(iVar4 * iVar10) * 2) {
      uVar1 = *(ushort *)(lVar8 + uVar14 * 2);
      *(ushort *)(uVar11 + uVar14 * 2) = uVar1;
      iVar6 = 0;
      if ((ushort)(uVar1 - 1) < 0xfffe) {
        iVar6 = (int)(((ulong)(uVar1 >> 1) | 0x7fff8000) / (ulong)(uint)uVar1);
      }
      lVar8 = lVar8 + 2;
      uVar11 = uVar11 + 2;
      iVar9 = iVar10;
      do {
        uVar2 = *(ushort *)(lVar8 + -2);
        uVar12 = 0xffff;
        if ((uVar2 < uVar1) && (uVar12 = uVar2, uVar2 != 0 && uVar1 != 0xffff)) {
          uVar12 = (ushort)((uint)uVar2 * iVar6 + 0x4000 >> 0xf);
        }
        *(ushort *)(uVar11 - 2) = uVar12;
        lVar8 = lVar8 + 2;
        uVar11 = uVar11 + 2;
        iVar9 = iVar9 + -1;
      } while (1 < iVar9);
    }
    png_write_row(png_ptr,*(png_const_bytep *)((long)argument + 0x38));
    lVar15 = lVar15 + (ulong)(*(uint *)((long)argument + 0x30) & 0xfffe);
  }
  return 1;
}

Assistant:

static int
png_write_image_16bit(png_voidp argument)
{
   png_image_write_control *display = png_voidcast(png_image_write_control*,
       argument);
   png_imagep image = display->image;
   png_structrp png_ptr = image->opaque->png_ptr;

   png_const_uint_16p input_row = png_voidcast(png_const_uint_16p,
       display->first_row);
   png_uint_16p output_row = png_voidcast(png_uint_16p, display->local_row);
   png_uint_16p row_end;
   unsigned int channels = (image->format & PNG_FORMAT_FLAG_COLOR) != 0 ?
       3 : 1;
   int aindex = 0;
   png_uint_32 y = image->height;

   if ((image->format & PNG_FORMAT_FLAG_ALPHA) != 0)
   {
#   ifdef PNG_SIMPLIFIED_WRITE_AFIRST_SUPPORTED
      if ((image->format & PNG_FORMAT_FLAG_AFIRST) != 0)
      {
         aindex = -1;
         ++input_row; /* To point to the first component */
         ++output_row;
      }
         else
            aindex = (int)channels;
#     else
         aindex = (int)channels;
#     endif
   }

   else
      png_error(png_ptr, "png_write_image: internal call error");

   /* Work out the output row end and count over this, note that the increment
    * above to 'row' means that row_end can actually be beyond the end of the
    * row; this is correct.
    */
   row_end = output_row + image->width * (channels+1);

   for (; y > 0; --y)
   {
      png_const_uint_16p in_ptr = input_row;
      png_uint_16p out_ptr = output_row;

      while (out_ptr < row_end)
      {
         png_uint_16 alpha = in_ptr[aindex];
         png_uint_32 reciprocal = 0;
         int c;

         out_ptr[aindex] = alpha;

         /* Calculate a reciprocal.  The correct calculation is simply
          * component/alpha*65535 << 15. (I.e. 15 bits of precision); this
          * allows correct rounding by adding .5 before the shift.  'reciprocal'
          * is only initialized when required.
          */
         if (alpha > 0 && alpha < 65535)
            reciprocal = ((0xffff<<15)+(alpha>>1))/alpha;

         c = (int)channels;
         do /* always at least one channel */
         {
            png_uint_16 component = *in_ptr++;

            /* The following gives 65535 for an alpha of 0, which is fine,
             * otherwise if 0/0 is represented as some other value there is more
             * likely to be a discontinuity which will probably damage
             * compression when moving from a fully transparent area to a
             * nearly transparent one.  (The assumption here is that opaque
             * areas tend not to be 0 intensity.)
             */
            if (component >= alpha)
               component = 65535;

            /* component<alpha, so component/alpha is less than one and
             * component*reciprocal is less than 2^31.
             */
            else if (component > 0 && alpha < 65535)
            {
               png_uint_32 calc = component * reciprocal;
               calc += 16384; /* round to nearest */
               component = (png_uint_16)(calc >> 15);
            }

            *out_ptr++ = component;
         }
         while (--c > 0);

         /* Skip to next component (skip the intervening alpha channel) */
         ++in_ptr;
         ++out_ptr;
      }

      png_write_row(png_ptr, png_voidcast(png_const_bytep, display->local_row));
      input_row += (png_uint_16)display->row_bytes/(sizeof (png_uint_16));
   }

   return 1;
}